

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_pairs.cpp
# Opt level: O3

string * trim(string *__return_storage_ptr__,string *s)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  size_type sVar4;
  stringstream ss;
  char local_1b9;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  sVar2 = s->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (s->_M_dataplus)._M_p;
    sVar4 = 0;
    do {
      cVar1 = pcVar3[sVar4];
      if (cVar1 != ' ') {
        local_1b9 = cVar1;
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_1b9,1);
      }
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string trim(const std::string& s)
{
	std::stringstream ss;
	for (const auto& c : s)
		if (c != ' ')
			ss << c;
	return ss.str();
}